

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

int menu_width_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  int iVar6;
  Am_Widget_Look look;
  Am_Object item;
  Am_Value_List components;
  Am_Widget_Look local_44;
  Am_Object local_40;
  Am_Value_List local_38;
  
  pAVar5 = Am_Object::Get(self,0x82,0);
  Am_Value_List::Am_Value_List(&local_38,pAVar5);
  pAVar5 = Am_Object::Get(self,0x1c8,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x17f,0);
  local_44.value = Am_MOTIF_LOOK_val;
  if ((pAVar5->type != 1) && (pAVar5->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&local_44,pAVar5);
  }
  local_44.value = (Am_Widget_Look_vals)(pAVar5->value).float_value;
  local_40.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_38);
  iVar6 = 0;
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_38);
    if (bVar1) break;
    pAVar5 = Am_Value_List::Get(&local_38);
    Am_Object::operator=(&local_40,pAVar5);
    pAVar5 = Am_Object::Get(&local_40,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
    if (bVar1) {
      pAVar5 = Am_Object::Get(&local_40,100,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      pAVar5 = Am_Object::Get(&local_40,0x66,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar5);
      if (iVar6 < iVar4 + iVar3) {
        iVar6 = iVar4 + iVar3;
      }
    }
    Am_Value_List::Next(&local_38);
  }
  bVar1 = local_44.value == Am_MACINTOSH_LOOK.value;
  Am_Object::~Am_Object(&local_40);
  Am_Value_List::~Am_Value_List(&local_38);
  return iVar6 + iVar2 + (uint)bVar1;
}

Assistant:

Am_Define_Formula(int, menu_width)
{
  // based on Am_map_width in opal.cc
  // the border depends upon the widget look;

  Am_Value_List components = self.Get(Am_GRAPHICAL_PARTS);
  int border = self.Get(Am_MENU_BORDER);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  int width = 0;
  Am_Object item;

  for (components.Start(); !components.Last(); components.Next()) {
    item = components.Get();
    if ((bool)item.Get(Am_VISIBLE)) {
      int item_left = item.Get(Am_LEFT);
      int item_width = item.Get(Am_WIDTH);
      int item_right = item_left + item_width;
      if (item_right > width)
        width = item_right;
    }
  }

  if (look == Am_MACINTOSH_LOOK)
    border++;
  return width + border; // we are adding the right border, Am_LEFT_OFFSET takes
                         // care of the left border
}